

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O3

void __thiscall wasm::BinaryInstWriter::visitSIMDReplace(BinaryInstWriter *this,SIMDReplace *curr)

{
  void *__buf;
  int __fd;
  LEB<unsigned_int,_unsigned_char> local_1c;
  
  local_1c.value._0_1_ = 0xfd;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             (uchar *)&local_1c);
  switch(curr->op) {
  case ReplaceLaneVecI8x16:
    __fd = (int)this->o;
    local_1c.value = 0x17;
    break;
  case ReplaceLaneVecI16x8:
    __fd = (int)this->o;
    local_1c.value = 0x1a;
    break;
  case ReplaceLaneVecI32x4:
    __fd = (int)this->o;
    local_1c.value = 0x1c;
    break;
  case ReplaceLaneVecI64x2:
    __fd = (int)this->o;
    local_1c.value = 0x1e;
    break;
  case ReplaceLaneVecF16x8:
    __fd = (int)this->o;
    local_1c.value = 0x122;
    break;
  case ReplaceLaneVecF32x4:
    __fd = (int)this->o;
    local_1c.value = 0x20;
    break;
  case ReplaceLaneVecF64x2:
    __fd = (int)this->o;
    local_1c.value = 0x22;
    break;
  default:
    goto switchD_00c9816b_default;
  }
  LEB<unsigned_int,_unsigned_char>::write(&local_1c,__fd,__buf,0xe35680);
switchD_00c9816b_default:
  if (0xf < curr->index) {
    __assert_fail("curr->index < 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                  ,0x277,"void wasm::BinaryInstWriter::visitSIMDReplace(SIMDReplace *)");
  }
  local_1c.value._0_1_ = curr->index;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             (uchar *)&local_1c);
  return;
}

Assistant:

void BinaryInstWriter::visitSIMDReplace(SIMDReplace* curr) {
  o << int8_t(BinaryConsts::SIMDPrefix);
  switch (curr->op) {
    case ReplaceLaneVecI8x16:
      o << U32LEB(BinaryConsts::I8x16ReplaceLane);
      break;
    case ReplaceLaneVecI16x8:
      o << U32LEB(BinaryConsts::I16x8ReplaceLane);
      break;
    case ReplaceLaneVecI32x4:
      o << U32LEB(BinaryConsts::I32x4ReplaceLane);
      break;
    case ReplaceLaneVecI64x2:
      o << U32LEB(BinaryConsts::I64x2ReplaceLane);
      break;
    case ReplaceLaneVecF16x8:
      o << U32LEB(BinaryConsts::F16x8ReplaceLane);
      break;
    case ReplaceLaneVecF32x4:
      o << U32LEB(BinaryConsts::F32x4ReplaceLane);
      break;
    case ReplaceLaneVecF64x2:
      o << U32LEB(BinaryConsts::F64x2ReplaceLane);
      break;
  }
  assert(curr->index < 16);
  o << uint8_t(curr->index);
}